

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

void __thiscall capnproto_test::capnp::test::TestExtends::Server::dispatchCall(Server *this)

{
  ushort in_CX;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context;
  uint16_t in_DX;
  long *in_RSI;
  
  context.hook._2_6_ = 0;
  context.hook._0_2_ = in_CX;
  dispatchCall(this,(long)in_RSI + *(long *)(*in_RSI + -0x18),in_DX,context);
  return;
}

Assistant:

::capnp::Capability::Server::DispatchCallResult TestExtends::Server::dispatchCall(
    uint64_t interfaceId, uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (interfaceId) {
    case 0xe4e9bac98670b748ull:
      return dispatchCallInternal(methodId, context);
    case 0x88eb12a0e0af92b2ull:
      return  ::capnproto_test::capnp::test::TestInterface::Server::dispatchCallInternal(methodId, context);
    default:
      return internalUnimplemented("capnp/test.capnp:TestExtends", interfaceId);
  }
}